

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++:211:40)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_test_c__:211:40)>
             *this)

{
  anon_class_16_2_8fc7c391_for_f *paVar1;
  uint uVar2;
  MutexGuarded<unsigned_int> *this_00;
  uint m;
  DebugComparison<unsigned_int_&,_const_int_&> _kjCondition;
  uint local_70;
  uint local_6c;
  MutexGuarded<unsigned_int> *local_68;
  uint *local_60;
  Fault local_58 [2];
  DebugComparison<unsigned_int_&,_const_int_&> local_48;
  
  paVar1 = &this->f;
  local_70 = (this->f).i;
  if ((local_70 & 1) == 0) {
    usleep(10000);
    local_70 = paVar1->i;
  }
  this_00 = (this->f).value;
  local_48.left = (uint *)((ulong)local_48.left & 0xffffffffffffff00);
  _::Mutex::lock(&this_00->mutex,0);
  local_60 = &this_00->value;
  local_48.left = (uint *)&PTR_check_00225ed0;
  local_48.right = (int *)&local_70;
  local_58[0].exception._0_1_ = 0;
  local_68 = this_00;
  local_48.op.content.ptr = (char *)local_60;
  _::Mutex::wait(&this_00->mutex,&local_48);
  uVar2 = this_00->value;
  this_00->value = uVar2 + 1;
  _::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  local_48.left = &local_6c;
  local_48.result = uVar2 == paVar1->i;
  local_48.op.content.ptr = " == ";
  local_48.op.content.size_ = 5;
  if (local_48.result) {
    return;
  }
  local_6c = uVar2;
  local_48.right = &paVar1->i;
  _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int_const&>&>
            (local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
             ,0xd7,FAILED,"m == i","_kjCondition,",&local_48);
  _::Debug::Fault::fatal(local_58);
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }